

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * __thiscall
VulkanHppGenerator::generateCppModuleUniqueHandleUsings_abi_cxx11_
          (string *__return_storage_ptr__,VulkanHppGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pFVar2;
  pointer pEVar3;
  char *this_00;
  ExtensionData *extension;
  pointer pEVar4;
  FeatureData *feature;
  pointer title;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  anon_class_16_2_7e9d40f7 generateUsingsAndProtection;
  string usingTemplate;
  string local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  VulkanHppGenerator *local_a8;
  anon_class_16_2_7e9d40f7 local_a0;
  string local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"  using VULKAN_HPP_NAMESPACE::Unique${handleName};\n","");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "\n  //======================\n  //=== UNIQUE HANDLEs ===\n  //======================\n"
             ,"");
  paVar1 = &local_d0.field_2;
  this_00 = "VULKAN_HPP_NO_SMART_HANDLE";
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  local_b0 = &__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"VULKAN_HPP_NO_SMART_HANDLE","");
  generateProtection(&local_70,(VulkanHppGenerator *)this_00,&local_d0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_d0,"\n",&local_70.first);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  title = (this->m_features).
          super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pFVar2 = (this->m_features).
           super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_a8 = this;
  local_a0.usingTemplate = &local_90;
  local_a0.this = this;
  if (title != pFVar2) {
    do {
      generateCppModuleUniqueHandleUsings::anon_class_16_2_7e9d40f7::operator()
                (&local_d0,&local_a0,&title->requireData,&title->name);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      title = title + 1;
    } while (title != pFVar2);
  }
  pEVar4 = (local_a8->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar3 = (local_a8->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar4 != pEVar3) {
    do {
      generateCppModuleUniqueHandleUsings::anon_class_16_2_7e9d40f7::operator()
                (&local_d0,&local_a0,&pEVar4->requireData,&pEVar4->name);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      pEVar4 = pEVar4 + 1;
    } while (pEVar4 != pEVar3);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"  using VULKAN_HPP_NAMESPACE::UniqueHandleTraits;\n");
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_70.second._M_dataplus._M_p,
             local_70.second._M_dataplus._M_p + local_70.second._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_d0,"\n");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.second._M_dataplus._M_p != &local_70.second.field_2) {
    operator_delete(local_70.second._M_dataplus._M_p,
                    local_70.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.first._M_dataplus._M_p != &local_70.first.field_2) {
    operator_delete(local_70.first._M_dataplus._M_p,local_70.first.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCppModuleUniqueHandleUsings() const
{
  auto const usingTemplate                        = std::string{ R"(  using VULKAN_HPP_NAMESPACE::Unique${handleName};
)" };
  auto       uniqueHandleUsings                   = std::string{ R"(
  //======================
  //=== UNIQUE HANDLEs ===
  //======================
)" };
  auto const [smartHandleEnter, smartHandleLeave] = generateProtection( "VULKAN_HPP_NO_SMART_HANDLE", false );

  uniqueHandleUsings += "\n" + smartHandleEnter;

  auto const generateUsingsAndProtection = [&usingTemplate, this]( std::vector<RequireData> const & requireData, std::string const & title )
  {
    auto usings = std::string{};
    for ( auto const & require : requireData )
    {
      for ( auto const & type : require.types )
      {
        if ( auto const & handleIt = m_handles.find( type.name ); handleIt != m_handles.end() && !handleIt->second.deleteCommand.empty() )
        {
          usings += replaceWithMap( usingTemplate, { { "handleName", stripPrefix( handleIt->first, "Vk" ) } } );
        }
      }
    }
    return addTitleAndProtection( title, usings );
  };

  for ( auto const & feature : m_features )
  {
    uniqueHandleUsings += generateUsingsAndProtection( feature.requireData, feature.name );
  }

  for ( auto const & extension : m_extensions )
  {
    uniqueHandleUsings += generateUsingsAndProtection( extension.requireData, extension.name );
  }

  uniqueHandleUsings += R"(  using VULKAN_HPP_NAMESPACE::UniqueHandleTraits;
)";

  uniqueHandleUsings += smartHandleLeave + "\n";

  return uniqueHandleUsings;
}